

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

wchar_t mon_create_drop_count(monster_race *race,_Bool maximize,_Bool specific,int *specific_count)

{
  bitflag *flags;
  _Bool _Var1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  monster_drop *pmVar5;
  int iVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  int iVar8;
  
  flags = race->flags;
  _Var1 = flag_has_dbg(flags,0xb,0x27,"race->flags","RF_DROP_20");
  if ((int)CONCAT71(in_register_00000031,maximize) == 0) {
    uVar7 = 0;
    if (_Var1) {
      uVar3 = Rand_div(100);
      uVar7 = (uint)((int)uVar3 < 0x14);
    }
    _Var1 = flag_has_dbg(flags,0xb,0x1f,"race->flags","RF_DROP_40");
    if (_Var1) {
      uVar3 = Rand_div(100);
      uVar7 = uVar7 + ((int)uVar3 < 0x28);
    }
    _Var1 = flag_has_dbg(flags,0xb,0x20,"race->flags","RF_DROP_60");
    if (_Var1) {
      uVar3 = Rand_div(100);
      uVar7 = uVar7 + ((int)uVar3 < 0x3c);
    }
    _Var1 = flag_has_dbg(flags,0xb,0x24,"race->flags","RF_DROP_4");
    if (_Var1) {
      iVar8 = rand_range(2,6);
      uVar7 = uVar7 + iVar8;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x23,"race->flags","RF_DROP_3");
    if (_Var1) {
      iVar8 = rand_range(2,4);
      uVar7 = uVar7 + iVar8;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x22,"race->flags","RF_DROP_2");
    if (_Var1) {
      iVar8 = rand_range(1,3);
      uVar7 = uVar7 + iVar8;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x21,"race->flags","RF_DROP_1");
    iVar8 = _Var1 + uVar7;
    iVar6 = 0;
    for (pmVar5 = race->drops; pmVar5 != (monster_drop *)0x0; pmVar5 = pmVar5->next) {
      uVar3 = Rand_div(100);
      if (uVar3 < pmVar5->percent_chance) {
        uVar3 = Rand_div(pmVar5->max - pmVar5->min);
        iVar6 = uVar3 + iVar6 + pmVar5->min;
      }
    }
  }
  else {
    _Var2 = flag_has_dbg(flags,0xb,0x1f,"race->flags","RF_DROP_40");
    uVar7 = _Var1 + 1;
    if (!_Var2) {
      uVar7 = (uint)_Var1;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x20,"race->flags","RF_DROP_60");
    _Var2 = flag_has_dbg(flags,0xb,0x24,"race->flags","RF_DROP_4");
    iVar8 = _Var1 + uVar7 + 6;
    if (!_Var2) {
      iVar8 = _Var1 + uVar7;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x23,"race->flags","RF_DROP_3");
    iVar6 = iVar8 + 4;
    if (!_Var1) {
      iVar6 = iVar8;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x22,"race->flags","RF_DROP_2");
    iVar8 = iVar6 + 3;
    if (!_Var1) {
      iVar8 = iVar6;
    }
    _Var1 = flag_has_dbg(flags,0xb,0x21,"race->flags","RF_DROP_1");
    iVar8 = (uint)_Var1 + iVar8;
    iVar6 = 0;
    for (pmVar5 = race->drops; pmVar5 != (monster_drop *)0x0; pmVar5 = pmVar5->next) {
      iVar6 = iVar6 + pmVar5->max;
    }
  }
  if (specific_count != (int *)0x0) {
    *specific_count = iVar6;
  }
  iVar4 = 0;
  if (specific) {
    iVar4 = iVar6;
  }
  return iVar4 + iVar8;
}

Assistant:

int mon_create_drop_count(const struct monster_race *race, bool maximize,
	bool specific, int *specific_count)
{
	int number = 0;
	int specnum = 0;
	static const int drop_4_max = 6;
	static const int drop_3_max = 4;
	static const int drop_2_max = 3;
	struct monster_drop *drop;

	if (maximize) {
		if (rf_has(race->flags, RF_DROP_20)) number++;
		if (rf_has(race->flags, RF_DROP_40)) number++;
		if (rf_has(race->flags, RF_DROP_60)) number++;
		if (rf_has(race->flags, RF_DROP_4)) number += drop_4_max;
		if (rf_has(race->flags, RF_DROP_3)) number += drop_3_max;
		if (rf_has(race->flags, RF_DROP_2)) number += drop_2_max;
		if (rf_has(race->flags, RF_DROP_1)) number++;
		for (drop = race->drops; drop; drop = drop->next) {
			specnum += drop->max;
		}
	} else {
		if (rf_has(race->flags, RF_DROP_20) && randint0(100) < 20) number++;
		if (rf_has(race->flags, RF_DROP_40) && randint0(100) < 40) number++;
		if (rf_has(race->flags, RF_DROP_60) && randint0(100) < 60) number++;
		if (rf_has(race->flags, RF_DROP_4)) number += rand_range(2, drop_4_max);
		if (rf_has(race->flags, RF_DROP_3)) number += rand_range(2, drop_3_max);
		if (rf_has(race->flags, RF_DROP_2)) number += rand_range(1, drop_2_max);
		if (rf_has(race->flags, RF_DROP_1)) number++;
		for (drop = race->drops; drop; drop = drop->next) {
			if ((unsigned int)randint0(100) <
					drop->percent_chance) {
				specnum += randint0(drop->max - drop->min) +
					drop->min;
			}
		}
	}
	if (specific) {
		number += specnum;
	}
	if (specific_count) {
		*specific_count = specnum;
	}
	return number;
}